

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

uint32_t __thiscall Jinx::Impl::Parser::GetOperatorPrecedence(Parser *this,Opcode opcode)

{
  uint32_t uVar1;
  
  switch(opcode) {
  case And:
switchD_001cc8aa_caseD_1e:
    uVar1 = 4;
    break;
  case CallFunc:
  case Cast:
  case Decrement:
  case EraseItr:
  case ErasePropKeyVal:
  case EraseVarKeyVal:
  case Exit:
  case Function:
switchD_001cc8aa_caseD_16:
    __assert_fail("!\"Unknown opcode used in binary expression\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                  ,0xbb,"uint32_t Jinx::Impl::Parser::GetOperatorPrecedence(Opcode) const");
  case Divide:
switchD_001cc8aa_caseD_19:
    return 1;
  case Equals:
  case Greater:
  case GreaterEq:
LAB_001cc8ce:
    return 3;
  default:
    switch(opcode) {
    case Less:
    case LessEq:
    case NotEquals:
      goto LAB_001cc8ce;
    case Library:
    case LoopCount:
    case LoopOver:
    case Negate:
    case Not:
      goto switchD_001cc8aa_caseD_16;
    case Mod:
    case Multiply:
      goto switchD_001cc8aa_caseD_19;
    case Or:
      goto switchD_001cc8aa_caseD_1e;
    default:
      if (opcode != Subtract) goto switchD_001cc8aa_caseD_16;
    }
  case Add:
    uVar1 = 2;
  }
  return uVar1;
}

Assistant:

inline_t uint32_t Parser::GetOperatorPrecedence(Opcode opcode) const
	{
		// Lower values mean higher precedence
		switch (opcode)
		{
		case Opcode::Multiply: return 1;
		case Opcode::Divide: return 1;
		case Opcode::Mod: return 1;
		case Opcode::Add: return 2;
		case Opcode::Subtract: return 2;
		case Opcode::Less: return 3;
		case Opcode::LessEq: return 3;
		case Opcode::Greater: return 3;
		case Opcode::GreaterEq: return 3;
		case Opcode::Equals: return 3;
		case Opcode::NotEquals: return 3;
		case Opcode::And: return 4;
		case Opcode::Or: return 4;
		default:
			assert(!"Unknown opcode used in binary expression");
			return 0;
		};
	}